

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

int Dar_BalanceFindLeft(Vec_Ptr_t *vSuper)

{
  uint uVar1;
  void **ppvVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = vSuper->nSize;
  uVar4 = 0;
  if (2 < (long)(int)uVar1) {
    ppvVar2 = vSuper->pArray;
    uVar6 = (ulong)(uVar1 - 3) + 1;
    do {
      if (((*(ulong *)(((ulong)ppvVar2[uVar6 - 1] & 0xfffffffffffffffe) + 0x18) ^
           *(ulong *)(((ulong)ppvVar2[(long)(int)uVar1 + -2] & 0xfffffffffffffffe) + 0x18)) &
          0xffffff00000000) != 0) goto LAB_004f7861;
      uVar5 = uVar6 - 1;
      bVar3 = 0 < (long)uVar6;
      uVar6 = uVar5;
    } while (uVar5 != 0 && bVar3);
    uVar6 = 0;
LAB_004f7861:
    uVar4 = (uint)uVar6;
    if (uVar1 <= uVar4) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (((*(ulong *)(((ulong)ppvVar2[(long)(int)uVar1 + -2] & 0xfffffffffffffffe) + 0x18) ^
         *(ulong *)(((ulong)ppvVar2[uVar6 & 0xffffffff] & 0xfffffffffffffffe) + 0x18)) &
        0xffffff00000000) != 0) {
      __assert_fail("Aig_ObjLevel(Aig_Regular(pObjLeft)) == Aig_ObjLevel(Aig_Regular(pObjRight))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                    ,0x102,"int Dar_BalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return uVar4;
}

Assistant:

int Dar_BalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pObjRight, * pObjLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pObjRight = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pObjLeft = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Aig_ObjLevel(Aig_Regular(pObjLeft)) != Aig_ObjLevel(Aig_Regular(pObjRight)) )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pObjLeft = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Aig_ObjLevel(Aig_Regular(pObjLeft)) == Aig_ObjLevel(Aig_Regular(pObjRight)) );
    return Current;
}